

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

void __thiscall tinyxml2::XMLDocument::Parse(XMLDocument *this)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  
  pbVar4 = (byte *)this->_charBuffer;
  bVar2 = *pbVar4;
  while (-1 < (char)bVar2) {
    iVar3 = isspace((uint)bVar2);
    if (iVar3 == 0) break;
    pbVar1 = pbVar4 + 1;
    pbVar4 = pbVar4 + 1;
    bVar2 = *pbVar1;
  }
  this->_writeBOM = false;
  if (((*pbVar4 == 0xef) && (pbVar4[1] == 0xbb)) && (pbVar4[2] == 0xbf)) {
    this->_writeBOM = true;
    pbVar4 = pbVar4 + 3;
  }
  if (*pbVar4 != 0) {
    (*(this->super_XMLNode)._vptr_XMLNode[0x11])(this,pbVar4,0);
    return;
  }
  this->_errorID = XML_ERROR_EMPTY_DOCUMENT;
  this->_errorStr1 = (char *)0x0;
  this->_errorStr2 = (char *)0x0;
  return;
}

Assistant:

void XMLDocument::Parse()
{
    TIXMLASSERT( NoChildren() ); // Clear() must have been called previously
    TIXMLASSERT( _charBuffer );
    char* p = _charBuffer;
    p = XMLUtil::SkipWhiteSpace( p );
    p = const_cast<char*>( XMLUtil::ReadBOM( p, &_writeBOM ) );
    if ( !*p ) {
        SetError( XML_ERROR_EMPTY_DOCUMENT, 0, 0 );
        return;
    }
    ParseDeep(p, 0 );
}